

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::AddDefinition(cmMakefile *this,string *name,char *value)

{
  Internals *pIVar1;
  cmake *pcVar2;
  bool bVar3;
  size_t sVar4;
  cmVariableWatch *this_00;
  _List_const_iterator<cmDefinitions> local_58 [2];
  _List_node_base local_48;
  StackConstIter local_38;
  
  if (value != (char *)0x0) {
    local_58[0]._M_node = (_List_node_base *)(this->Internal).x_;
    local_38.current._M_node =
         (_List_const_iterator<cmDefinitions>)
         (((Internals *)local_58[0]._M_node)->VarStack).
         super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl._M_node.
         super__List_node_base._M_next;
    bVar3 = cmDefinitions::HasKey(name,(StackConstIter *)local_58,&local_38);
    if (bVar3) {
      LogUnused(this,"changing definition",name);
    }
    pIVar1 = (this->Internal).x_;
    local_58[0]._M_node = &local_48;
    sVar4 = strlen(value);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,value,value + sVar4);
    cmDefinitions::Set((cmDefinitions *)
                       ((pIVar1->VarStack).
                        super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                        _M_node.super__List_node_base._M_prev + 1),name,(char *)local_58[0]._M_node)
    ;
    if (local_58[0]._M_node != &local_48) {
      operator_delete(local_58[0]._M_node,(ulong)((long)&(local_48._M_next)->_M_next + 1));
    }
    pcVar2 = this->LocalGenerator->GlobalGenerator->CMakeInstance;
    if (pcVar2 == (cmake *)0x0) {
      this_00 = (cmVariableWatch *)0x0;
    }
    else {
      this_00 = pcVar2->VariableWatch;
    }
    if (this_00 != (cmVariableWatch *)0x0) {
      cmVariableWatch::VariableAccessed(this_00,name,3,value,this);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddDefinition(const std::string& name, const char* value)
{
  if (!value )
    {
    return;
    }

  if (this->VariableInitialized(name))
    {
    this->LogUnused("changing definition", name);
    }
  this->Internal->SetDefinition(name, value);

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if ( vv )
    {
    vv->VariableAccessed(name,
                         cmVariableWatch::VARIABLE_MODIFIED_ACCESS,
                         value,
                         this);
    }
#endif
}